

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guild.cpp
# Opt level: O3

void Handlers::Guild_Create(Character *character,PacketReader *reader)

{
  pointer pcVar1;
  World *pWVar2;
  GuildManager *pGVar3;
  long lVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint num;
  mapped_type *pmVar9;
  PacketBuilder reply;
  shared_ptr<Guild_Create> create;
  shared_ptr<Guild> guild;
  string description;
  string tag;
  string rank_str;
  string name;
  undefined1 local_168 [48];
  undefined1 local_138 [24];
  __node_base local_120;
  pointer local_118;
  __node_base local_110;
  _Alloc_hider local_108;
  __node_base_ptr local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  string local_c8;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  string local_48;
  
  PacketReader::GetInt(reader);
  PacketReader::GetByte(reader);
  PacketReader::GetBreakString_abi_cxx11_(&local_e8,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_(&local_48,reader,0xff);
  PacketReader::GetBreakString_abi_cxx11_((string *)&local_108,reader,0xff);
  if (local_e8._M_string_length < 4) {
    pWVar2 = character->world;
    pcVar1 = local_168 + 0x10;
    local_168._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildMaxNameLength","");
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar2->config,(key_type *)local_168);
    iVar7 = util::variant::GetInt(pmVar9);
    bVar6 = true;
    if (local_48._M_string_length <= (ulong)(long)iVar7) {
      pGVar3 = character->world->guildmanager;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_108._M_p,local_108._M_p + (long)local_100);
      bVar6 = GuildManager::ValidDescription(pGVar3,&local_68);
      bVar6 = !bVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    if ((pointer)local_168._0_8_ != pcVar1) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    if (((!bVar6) && (character->npc_type == Guild)) &&
       ((character->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0)) {
      iVar7 = Character::HasItem(character,1,false);
      pWVar2 = character->world;
      local_168._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildPrice","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar2->config,(key_type *)local_168);
      iVar8 = util::variant::GetInt(pmVar9);
      if ((pointer)local_168._0_8_ != pcVar1) {
        operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      }
      if (iVar8 <= iVar7) {
        pGVar3 = character->world->guildmanager;
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_88,local_e8._M_dataplus._M_p,
                   (long)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_e8._M_dataplus._M_p + local_e8._M_string_length);
        GuildManager::GetCreate((GuildManager *)local_138,(string *)pGVar3);
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
        if ((local_138._0_8_ != 0) && (*(Character **)(local_138._0_8_ + 0x20) == character)) {
          lVar4 = *(long *)(local_138._0_8_ + 0x70);
          lVar5 = *(long *)(local_138._0_8_ + 0x68);
          pWVar2 = character->world;
          local_168._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_168,"GuildCreateMembers","");
          pmVar9 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&pWVar2->config,(key_type *)local_168);
          iVar7 = util::variant::GetInt(pmVar9);
          if ((pointer)local_168._0_8_ != pcVar1) {
            operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
          }
          if ((ulong)(long)iVar7 <= (ulong)(lVar4 - lVar5 >> 4)) {
            pGVar3 = character->world->guildmanager;
            local_118 = (pointer)local_138._0_8_;
            local_110._M_nxt = (_Hash_node_base *)local_138._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_138._8_8_ + 8) = *(_Atomic_word *)(local_138._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_138._8_8_ + 8) = *(_Atomic_word *)(local_138._8_8_ + 8) + 1;
              }
            }
            local_a8[0] = local_98;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_a8,local_108._M_p,local_108._M_p + (long)local_100);
            GuildManager::CreateGuild
                      ((GuildManager *)(local_138 + 0x10),(shared_ptr<Guild_Create> *)pGVar3,
                       (string *)&local_118);
            if (local_a8[0] != local_98) {
              operator_delete(local_a8[0],local_98[0] + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_nxt !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._M_nxt);
            }
            pWVar2 = character->world;
            local_168._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"GuildPrice","");
            pmVar9 = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&pWVar2->config,(key_type *)local_168);
            iVar7 = util::variant::GetInt(pmVar9);
            Character::DelItem(character,1,iVar7);
            if ((pointer)local_168._0_8_ != pcVar1) {
              operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
            }
            Character::GuildRankString_abi_cxx11_(&local_c8,character);
            PacketBuilder::PacketBuilder
                      ((PacketBuilder *)local_168,PACKET_GUILD,PACKET_CREATE,
                       (long)&(((Timer *)(local_c8._M_string_length + 8))->impl)._M_t.
                              super___uniq_ptr_impl<Timer::impl_t,_std::default_delete<Timer::impl_t>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Timer::impl_t_*,_std::default_delete<Timer::impl_t>_>
                              .super__Head_base<0UL,_Timer::impl_t_*,_false> +
                       *(long *)(local_138._16_8_ + 0x40) + 5);
            iVar7 = Character::PlayerID(*(Character **)(local_138._0_8_ + 0x20));
            PacketBuilder::AddShort((PacketBuilder *)local_168,(unsigned_short)iVar7);
            PacketBuilder::AddByte((PacketBuilder *)local_168,0xff);
            PacketBuilder::AddBreakString
                      ((PacketBuilder *)local_168,(string *)(local_138._16_8_ + 0x18),0xff);
            PacketBuilder::AddBreakString
                      ((PacketBuilder *)local_168,(string *)(local_138._16_8_ + 0x38),0xff);
            PacketBuilder::AddBreakString((PacketBuilder *)local_168,&local_c8,0xff);
            num = Character::HasItem(character,1,false);
            PacketBuilder::AddInt((PacketBuilder *)local_168,num);
            Character::Send(character,(PacketBuilder *)local_168);
            this = (character->guild_create).
                   super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (character->guild_create).super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            (character->guild_create).super___shared_ptr<Guild_Create,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
            }
            PacketBuilder::~PacketBuilder((PacketBuilder *)local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_nxt !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_nxt);
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Guild_Create(Character *character, PacketReader &reader)
{
	/*int session = */reader.GetInt();
	reader.GetByte();
	std::string tag = reader.GetBreakString();
	std::string name = reader.GetBreakString();
	std::string description = reader.GetBreakString();

	if (tag.length() > 3
	 || name.length() > std::size_t(int(character->world->config["GuildMaxNameLength"]))
	 || !character->world->guildmanager->ValidDescription(description))
	{
		return;
	}

	if (character->npc_type == ENF::Guild)
	{
		if (!character->guild
		 && character->HasItem(1) >= static_cast<int>(character->world->config["GuildPrice"]))
		{
			std::shared_ptr<class Guild_Create> create = character->world->guildmanager->GetCreate(tag);

			if (create && create->leader == character
			 && create->members.size() >= static_cast<std::size_t>(static_cast<int>(character->world->config["GuildCreateMembers"])))
			{
				std::shared_ptr<Guild> guild = character->world->guildmanager->CreateGuild(create, description);

				character->DelItem(1, character->world->config["GuildPrice"]);

				std::string rank_str = character->GuildRankString();

				PacketBuilder reply(PACKET_GUILD, PACKET_CREATE, 13 + guild->name.length() + rank_str.length());
				reply.AddShort(create->leader->PlayerID());
				reply.AddByte(255);
				reply.AddBreakString(guild->tag);
				reply.AddBreakString(guild->name);
				reply.AddBreakString(rank_str);
				reply.AddInt(character->HasItem(1));
				character->Send(reply);

				character->guild_create.reset();
			}
		}
	}
}